

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pageant.c
# Opt level: O0

void pageant_listen_closing(Plug *plug,PlugCloseType type,char *error_msg)

{
  pageant_listen_state *pl;
  char *error_msg_local;
  PlugCloseType type_local;
  Plug *plug_local;
  
  if (type != PLUGCLOSE_NORMAL) {
    pageant_listener_client_log
              ((PageantListenerClient *)plug[-2].vt,"listening socket: error: %s",error_msg);
  }
  sk_close((Socket *)plug[-3].vt);
  plug[-3].vt = (PlugVtable *)0x0;
  return;
}

Assistant:

static void pageant_listen_closing(Plug *plug, PlugCloseType type,
                                   const char *error_msg)
{
    struct pageant_listen_state *pl = container_of(
        plug, struct pageant_listen_state, plug);
    if (type != PLUGCLOSE_NORMAL)
        pageant_listener_client_log(pl->plc, "listening socket: error: %s",
                                    error_msg);
    sk_close(pl->listensock);
    pl->listensock = NULL;
}